

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChSystem.cpp
# Opt level: O2

bool __thiscall
chrono::ChSystem::ManageSleepingBodies()::_wakeup_reporter_class::OnReportContact(chrono::
ChVector<double>const&,chrono::ChVector<double>const&,chrono::
ChMatrix33<double>const&,double_const&,double_const&,chrono::ChVector<double>const&,chrono::
ChVector<double>const&,chrono::ChContactable*,chrono::ChContactable__
          (void *this,ChVector<double> *pA,ChVector<double> *pB,ChMatrix33<double> *plane_coord,
          double *distance,double *eff_radius,ChVector<double> *react_forces,
          ChVector<double> *react_torques,ChContactable *contactobjA,ChContactable *contactobjB)

{
  bool bVar1;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  ChBody *this_00;
  ChBody *this_01;
  
  if (contactobjB != (ChContactable *)0x0 && contactobjA != (ChContactable *)0x0) {
    this_00 = (ChBody *)__dynamic_cast(contactobjA,&ChContactable::typeinfo,&ChBody::typeinfo,0x170)
    ;
    this_01 = (ChBody *)__dynamic_cast(contactobjB,&ChContactable::typeinfo,&ChBody::typeinfo,0x170)
    ;
    if (this_01 != (ChBody *)0x0 && this_00 != (ChBody *)0x0) {
      bVar1 = ChBody::GetSleeping(this_00);
      bVar2 = ChBody::GetSleeping(this_01);
      bVar3 = ChBody::BFlagGet(this_00,COULDSLEEP);
      bVar4 = ChBody::BFlagGet(this_01,COULDSLEEP);
      bVar5 = ChBody::GetBodyFixed(this_00);
      bVar6 = ChBody::GetBodyFixed(this_01);
      if ((bVar1 && (!bVar2 && !bVar4)) && !bVar6) {
        ChBody::SetSleeping(this_00,false);
        *(undefined1 *)((long)this + 9) = 1;
      }
      if ((bVar2 && (!bVar1 && !bVar3)) && !bVar5) {
        ChBody::SetSleeping(this_01,false);
        *(undefined1 *)((long)this + 9) = 1;
      }
      if (((!bVar2 && !bVar4) && bVar3) && !bVar6) {
        ChBody::BFlagSet(this_00,COULDSLEEP,false);
      }
      if (!bVar5 && ((!bVar1 && !bVar3) && bVar4)) {
        ChBody::BFlagSet(this_01,COULDSLEEP,false);
      }
      *(byte *)((long)this + 8) = *(byte *)((long)this + 8) | (bVar1 || bVar2);
    }
  }
  return true;
}

Assistant:

virtual bool OnReportContact(
            const ChVector<>& pA,             // get contact pA
            const ChVector<>& pB,             // get contact pB
            const ChMatrix33<>& plane_coord,  // get contact plane coordsystem (A column 'X' is contact normal)
            const double& distance,           // get contact distance
            const double& eff_radius,         // effective radius of curvature at contact
            const ChVector<>& react_forces,   // get react.forces (if already computed). In coordsystem 'plane_coord'
            const ChVector<>& react_torques,  // get react.torques, if rolling friction (if already computed).
            ChContactable* contactobjA,  // get model A (note: some containers may not support it and could be zero!)
            ChContactable* contactobjB   // get model B (note: some containers may not support it and could be zero!)
            ) override {
            if (!(contactobjA && contactobjB))
                return true;
            ChBody* b1 = dynamic_cast<ChBody*>(contactobjA);
            ChBody* b2 = dynamic_cast<ChBody*>(contactobjB);
            if (!(b1 && b2))
                return true;
            bool sleep1 = b1->GetSleeping();
            bool sleep2 = b2->GetSleeping();
            bool could_sleep1 = b1->BFlagGet(ChBody::BodyFlag::COULDSLEEP);
            bool could_sleep2 = b2->BFlagGet(ChBody::BodyFlag::COULDSLEEP);
            bool ground1 = b1->GetBodyFixed();
            bool ground2 = b2->GetBodyFixed();
            if (sleep1 && !(sleep2 || could_sleep2) && !ground2) {
                b1->SetSleeping(false);
                need_Setup_A = true;
            }
            if (sleep2 && !(sleep1 || could_sleep1) && !ground1) {
                b2->SetSleeping(false);
                need_Setup_A = true;
            }
            if (could_sleep1 && !(sleep2 || could_sleep2) && !ground2) {
                b1->BFlagSet(ChBody::BodyFlag::COULDSLEEP, false);
            }
            if (could_sleep2 && !(sleep1 || could_sleep1) && !ground1) {
                b2->BFlagSet(ChBody::BodyFlag::COULDSLEEP, false);
            }
            someone_sleeps = sleep1 | sleep2 | someone_sleeps;

            return true;  // to continue scanning contacts
        }